

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CFG::WhileEachBlockInReversePostOrder
          (CFG *this,BasicBlock *bb,function<bool_(spvtools::opt::BasicBlock_*)> *f)

{
  bool bVar1;
  reference ppBVar2;
  undefined1 local_88 [16];
  reverse_iterator current_bb;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  seen;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> po;
  function<bool_(spvtools::opt::BasicBlock_*)> *f_local;
  BasicBlock *bb_local;
  CFG *this_local;
  
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::vector
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             &seen._M_h._M_single_bucket);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   *)&current_bb);
  ComputePostOrderTraversal
            (this,bb,(vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)&seen._M_h._M_single_bucket,
             (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
              *)&current_bb);
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::rbegin
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             (local_88 + 8));
  do {
    std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::rend
              ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               local_88);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
                             *)(local_88 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
                             *)local_88);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_009266bb:
      std::
      unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
      ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)&current_bb);
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      ~vector((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
              &seen._M_h._M_single_bucket);
      return this_local._7_1_;
    }
    ppBVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
                           *)(local_88 + 8));
    bVar1 = IsPseudoExitBlock(this,*ppBVar2);
    if (!bVar1) {
      ppBVar2 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
                             *)(local_88 + 8));
      bVar1 = IsPseudoEntryBlock(this,*ppBVar2);
      if (!bVar1) {
        ppBVar2 = std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
                  ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
                               *)(local_88 + 8));
        bVar1 = std::function<bool_(spvtools::opt::BasicBlock_*)>::operator()(f,*ppBVar2);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_009266bb;
        }
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::BasicBlock_**,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>
                  *)(local_88 + 8));
  } while( true );
}

Assistant:

bool CFG::WhileEachBlockInReversePostOrder(
    BasicBlock* bb, const std::function<bool(BasicBlock*)>& f) {
  std::vector<BasicBlock*> po;
  std::unordered_set<BasicBlock*> seen;
  ComputePostOrderTraversal(bb, &po, &seen);

  for (auto current_bb = po.rbegin(); current_bb != po.rend(); ++current_bb) {
    if (!IsPseudoExitBlock(*current_bb) && !IsPseudoEntryBlock(*current_bb)) {
      if (!f(*current_bb)) {
        return false;
      }
    }
  }
  return true;
}